

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int imcomp_compress_tile
              (fitsfile *outfptr,long row,int datatype,void *tiledata,long tilelen,long tilenx,
              long tileny,int nullcheck,void *nullflagval,int *status)

{
  float fVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  int clen_00;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  LONGLONG *lldata;
  long hcomp_len;
  double bzero [1];
  double bscale [1];
  double noise5;
  double noise3;
  double noise2;
  int local_d0;
  float hcompscale;
  int ihcompscale;
  uint bzlen;
  size_t gzip_nelem;
  int tilecol;
  int nelem;
  short *cbuf;
  size_t clen;
  long ii;
  double actual_bzero;
  double zero;
  double scale;
  int local_80;
  int intlength;
  int flag;
  int nullval;
  int zbitpix;
  int cn_zblank;
  int *idata;
  long tilenx_local;
  long tilelen_local;
  void *tiledata_local;
  long lStack_48;
  int datatype_local;
  long row_local;
  fitsfile *outfptr_local;
  
  local_80 = 1;
  gzip_nelem._4_4_ = 0;
  _ihcompscale = 0;
  bzero[0] = 1.0;
  idata = (int *)tilenx;
  tilenx_local = tilelen;
  tilelen_local = (long)tiledata;
  tiledata_local._4_4_ = datatype;
  lStack_48 = row;
  row_local = (long)outfptr;
  memset(&hcomp_len,0,8);
  if (*status < 1) {
    fVar1 = *(float *)(*(long *)(row_local + 8) + 0x470);
    if (((((fVar1 != 9999.0) || (NAN(fVar1))) ||
         (*(int *)(*(long *)(row_local + 8) + 0x43c) == 0x15)) ||
        (*(int *)(*(long *)(row_local + 8) + 0x43c) == 0x16)) ||
       (((tiledata_local._4_4_ != 0x2a && (1 < tiledata_local._4_4_ - 0x52U)) &&
        (tiledata_local._4_4_ != 0xa3)))) {
      if ((*(long *)(*(long *)(row_local + 8) + 0x530) != 0) &&
         (gzip_nelem._0_4_ =
               (int)((lStack_48 + -1) %
                    ((*(long *)(*(long *)(row_local + 8) + 0x498) + -1) /
                     *(long *)(*(long *)(row_local + 8) + 0x440) + 1)),
         *(int *)(*(long *)(*(long *)(row_local + 8) + 0x530) + (long)(int)gzip_nelem * 4) ==
         lStack_48)) {
        if (*(long *)(*(long *)(*(long *)(row_local + 8) + 0x548) + (long)(int)gzip_nelem * 8) != 0)
        {
          free(*(void **)(*(long *)(*(long *)(row_local + 8) + 0x548) + (long)(int)gzip_nelem * 8));
        }
        if (*(long *)(*(long *)(*(long *)(row_local + 8) + 0x550) + (long)(int)gzip_nelem * 8) != 0)
        {
          free(*(void **)(*(long *)(*(long *)(row_local + 8) + 0x550) + (long)(int)gzip_nelem * 8));
        }
        *(undefined8 *)(*(long *)(*(long *)(row_local + 8) + 0x548) + (long)(int)gzip_nelem * 8) = 0
        ;
        *(undefined8 *)(*(long *)(*(long *)(row_local + 8) + 0x550) + (long)(int)gzip_nelem * 8) = 0
        ;
        *(undefined4 *)(*(long *)(*(long *)(row_local + 8) + 0x530) + (long)(int)gzip_nelem * 4) = 0
        ;
        *(undefined8 *)(*(long *)(*(long *)(row_local + 8) + 0x538) + (long)(int)gzip_nelem * 8) = 0
        ;
        *(undefined4 *)(*(long *)(*(long *)(row_local + 8) + 0x540) + (long)(int)gzip_nelem * 4) = 0
        ;
        *(undefined4 *)(*(long *)(*(long *)(row_local + 8) + 0x558) + (long)(int)gzip_nelem * 4) = 0
        ;
      }
      if (*(int *)(*(long *)(row_local + 8) + 0x43c) == -1) {
        iVar2 = imcomp_write_nocompress_tile
                          ((fitsfile *)row_local,lStack_48,tiledata_local._4_4_,
                           (void *)tilelen_local,tilenx_local,nullcheck,nullflagval,status);
        if (iVar2 < 1) {
          outfptr_local._4_4_ = *status;
        }
        else {
          outfptr_local._4_4_ = *status;
        }
      }
      else {
        _zbitpix = (LONGLONG *)tilelen_local;
        flag = *(int *)(*(long *)(row_local + 8) + 0x48c);
        nullval = *(int *)(*(long *)(row_local + 8) + 0x4ec);
        intlength = *(int *)(*(long *)(row_local + 8) + 0x518);
        if ((0 < flag) && (nullval != -1)) {
          nullcheck = 0;
        }
        zero = *(double *)(*(long *)(row_local + 8) + 0x500);
        actual_bzero = *(double *)(*(long *)(row_local + 8) + 0x508);
        ii = *(long *)(*(long *)(row_local + 8) + 0x510);
        if (tiledata_local._4_4_ == 0x15) {
          imcomp_convert_tile_tshort
                    ((fitsfile *)row_local,(void *)tilelen_local,tilenx_local,nullcheck,nullflagval,
                     intlength,flag,zero,actual_bzero,(double)ii,(int *)((long)&scale + 4),status);
        }
        else if (tiledata_local._4_4_ == 0x14) {
          imcomp_convert_tile_tushort
                    ((fitsfile *)row_local,(void *)tilelen_local,tilenx_local,nullcheck,nullflagval,
                     intlength,flag,zero,actual_bzero,(int *)((long)&scale + 4),status);
        }
        else if (tiledata_local._4_4_ == 0xb) {
          imcomp_convert_tile_tbyte
                    ((fitsfile *)row_local,(void *)tilelen_local,tilenx_local,nullcheck,nullflagval,
                     intlength,flag,zero,actual_bzero,(int *)((long)&scale + 4),status);
        }
        else if (tiledata_local._4_4_ == 0xc) {
          imcomp_convert_tile_tsbyte
                    ((fitsfile *)row_local,(void *)tilelen_local,tilenx_local,nullcheck,nullflagval,
                     intlength,flag,zero,actual_bzero,(int *)((long)&scale + 4),status);
        }
        else if (tiledata_local._4_4_ == 0x1f) {
          imcomp_convert_tile_tint
                    ((fitsfile *)row_local,(void *)tilelen_local,tilenx_local,nullcheck,nullflagval,
                     intlength,flag,zero,actual_bzero,(int *)((long)&scale + 4),status);
        }
        else if (tiledata_local._4_4_ == 0x1e) {
          imcomp_convert_tile_tuint
                    ((fitsfile *)row_local,(void *)tilelen_local,tilenx_local,nullcheck,nullflagval,
                     intlength,flag,zero,actual_bzero,(int *)((long)&scale + 4),status);
        }
        else {
          if (tiledata_local._4_4_ == 0x29) {
            ffpmsg("Integer*8 Long datatype is not supported when writing to compressed images");
            *status = 0x19a;
            return 0x19a;
          }
          if (tiledata_local._4_4_ == 0x28) {
            ffpmsg("Unsigned integer*8 datatype is not supported when writing to compressed images")
            ;
            *status = 0x19a;
            return 0x19a;
          }
          if (tiledata_local._4_4_ == 0x2a) {
            imcomp_convert_tile_tfloat
                      ((fitsfile *)row_local,lStack_48,(void *)tilelen_local,tilenx_local,
                       (long)idata,tileny,nullcheck,nullflagval,intlength,flag,zero,actual_bzero,
                       (int *)((long)&scale + 4),&local_80,bzero,(double *)&hcomp_len,status);
          }
          else {
            if (tiledata_local._4_4_ != 0x52) {
              ffpmsg("unsupported image datatype (imcomp_compress_tile)");
              *status = 0x19a;
              return 0x19a;
            }
            imcomp_convert_tile_tdouble
                      ((fitsfile *)row_local,lStack_48,(void *)tilelen_local,tilenx_local,
                       (long)idata,tileny,nullcheck,nullflagval,intlength,flag,zero,actual_bzero,
                       (int *)((long)&scale + 4),&local_80,bzero,(double *)&hcomp_len,status);
          }
        }
        if (*status < 1) {
          if (local_80 == 0) {
            if (*(int *)(*(long *)(row_local + 8) + 0x4e0) < 1) {
              if (*(int *)(*(long *)(row_local + 8) + 0x430) == 0) {
                fficol((fitsfile *)row_local,999,"GZIP_COMPRESSED_DATA","1PB",status);
              }
              else {
                fficol((fitsfile *)row_local,999,"GZIP_COMPRESSED_DATA","1QB",status);
              }
              if (*status < 1) {
                ffgcno((fitsfile *)row_local,0,"GZIP_COMPRESSED_DATA",
                       (int *)(*(long *)(row_local + 8) + 0x4e0),status);
              }
            }
            if (tiledata_local._4_4_ == 0x2a) {
              lVar3 = tilenx_local << 2;
              auVar6._8_4_ = (int)((ulong)lVar3 >> 0x20);
              auVar6._0_8_ = lVar3;
              auVar6._12_4_ = 0x45300000;
              dVar5 = ((auVar6._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)) * 1.1;
              uVar4 = (ulong)dVar5;
              cbuf = (short *)(uVar4 | (long)(dVar5 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f);
              _tilecol = (short *)calloc((size_t)cbuf,1);
              if (_tilecol == (short *)0x0) {
                ffpmsg("Memory allocation error. (imcomp_compress_tile)");
                *status = 0x71;
                return 0x71;
              }
              if (nullcheck == 1) {
                imcomp_float2nan((float *)tilelen_local,tilenx_local,(int *)tilelen_local,
                                 *nullflagval,status);
              }
              ffswap4((int *)tilelen_local,tilenx_local);
              compress2mem_from_mem
                        ((char *)tilelen_local,tilenx_local << 2,(char **)&tilecol,(size_t *)&cbuf,
                         realloc,(size_t *)&ihcompscale,status);
            }
            else {
              lVar3 = tilenx_local << 3;
              auVar7._8_4_ = (int)((ulong)lVar3 >> 0x20);
              auVar7._0_8_ = lVar3;
              auVar7._12_4_ = 0x45300000;
              dVar5 = ((auVar7._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)) * 1.1;
              uVar4 = (ulong)dVar5;
              cbuf = (short *)(uVar4 | (long)(dVar5 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f);
              _tilecol = (short *)calloc((size_t)cbuf,1);
              if (_tilecol == (short *)0x0) {
                ffpmsg("Memory allocation error. (imcomp_compress_tile)");
                *status = 0x71;
                return 0x71;
              }
              if (nullcheck == 1) {
                imcomp_double2nan((double *)tilelen_local,tilenx_local,(LONGLONG *)tilelen_local,
                                  *nullflagval,status);
              }
              ffswap8((double *)tilelen_local,tilenx_local);
              compress2mem_from_mem
                        ((char *)tilelen_local,tilenx_local << 3,(char **)&tilecol,(size_t *)&cbuf,
                         realloc,(size_t *)&ihcompscale,status);
            }
            ffpclb((fitsfile *)row_local,*(int *)(*(long *)(row_local + 8) + 0x4e0),lStack_48,1,
                   _ihcompscale,(uchar *)_tilecol,status);
            free(_tilecol);
          }
          else {
            cbuf = *(short **)(*(long *)(row_local + 8) + 0x4d0);
            _tilecol = (short *)calloc((size_t)cbuf,1);
            if (_tilecol == (short *)0x0) {
              ffpmsg("Memory allocation failure. (imcomp_compress_tile)");
              *status = 0x71;
              return 0x71;
            }
            iVar2 = (int)tilenx_local;
            if (*(int *)(*(long *)(row_local + 8) + 0x43c) == 0xb) {
              clen_00 = (int)cbuf;
              if (scale._4_4_ == 2) {
                gzip_nelem._4_4_ =
                     fits_rcomp_short((short *)_zbitpix,iVar2,(uchar *)_tilecol,clen_00,
                                      *(int *)(*(long *)(row_local + 8) + 0x51c));
              }
              else if (scale._4_4_ == 1) {
                gzip_nelem._4_4_ =
                     fits_rcomp_byte((char *)_zbitpix,iVar2,(uchar *)_tilecol,clen_00,
                                     *(int *)(*(long *)(row_local + 8) + 0x51c));
              }
              else {
                gzip_nelem._4_4_ =
                     fits_rcomp((int *)_zbitpix,iVar2,(uchar *)_tilecol,clen_00,
                                *(int *)(*(long *)(row_local + 8) + 0x51c));
              }
              if (gzip_nelem._4_4_ < 0) {
                free(_tilecol);
                ffpmsg("error Rice compressing image tile (imcomp_compress_tile)");
                *status = 0x19d;
                return 0x19d;
              }
              ffpclb((fitsfile *)row_local,*(int *)(*(long *)(row_local + 8) + 0x4d8),lStack_48,1,
                     (long)gzip_nelem._4_4_,(uchar *)_tilecol,status);
            }
            else if (*(int *)(*(long *)(row_local + 8) + 0x43c) == 0x1f) {
              for (clen = 0; (long)clen < tilenx_local; clen = clen + 1) {
                if ((*(int *)((long)_zbitpix + clen * 4) < 0) ||
                   (0xffffff < *(int *)((long)_zbitpix + clen * 4))) {
                  ffpmsg("data out of range for PLIO compression (0 - 2**24)");
                  *status = 0x19d;
                  return 0x19d;
                }
              }
              gzip_nelem._4_4_ = pl_p2li((int *)_zbitpix,1,_tilecol,iVar2);
              if (gzip_nelem._4_4_ < 0) {
                free(_tilecol);
                ffpmsg("error PLIO compressing image tile (imcomp_compress_tile)");
                *status = 0x19d;
                return 0x19d;
              }
              ffpcli((fitsfile *)row_local,*(int *)(*(long *)(row_local + 8) + 0x4d8),lStack_48,1,
                     (long)gzip_nelem._4_4_,_tilecol,status);
            }
            else if ((*(int *)(*(long *)(row_local + 8) + 0x43c) == 0x15) ||
                    (*(int *)(*(long *)(row_local + 8) + 0x43c) == 0x16)) {
              fVar1 = *(float *)(*(long *)(row_local + 8) + 0x470);
              if ((fVar1 != 9999.0) || ((NAN(fVar1) || (tiledata_local._4_4_ != 0x2a)))) {
                fVar1 = *(float *)(*(long *)(row_local + 8) + 0x470);
                if ((fVar1 != 9999.0) || ((NAN(fVar1) || (tiledata_local._4_4_ != 0x52)))) {
                  if (scale._4_4_ == 2) {
                    ffswap2((short *)_zbitpix,tilenx_local);
                  }
                  else if (scale._4_4_ == 4) {
                    ffswap4((int *)_zbitpix,tilenx_local);
                  }
                  if (scale._4_4_ == 2) {
                    if (*(int *)(*(long *)(row_local + 8) + 0x43c) == 0x16) {
                      fits_shuffle_2bytes((char *)tilelen_local,tilenx_local,status);
                    }
                    compress2mem_from_mem
                              ((char *)_zbitpix,tilenx_local << 1,(char **)&tilecol,(size_t *)&cbuf,
                               realloc,(size_t *)&ihcompscale,status);
                  }
                  else if (scale._4_4_ == 1) {
                    compress2mem_from_mem
                              ((char *)_zbitpix,tilenx_local,(char **)&tilecol,(size_t *)&cbuf,
                               realloc,(size_t *)&ihcompscale,status);
                  }
                  else {
                    if (*(int *)(*(long *)(row_local + 8) + 0x43c) == 0x16) {
                      fits_shuffle_4bytes((char *)tilelen_local,tilenx_local,status);
                    }
                    compress2mem_from_mem
                              ((char *)_zbitpix,tilenx_local << 2,(char **)&tilecol,(size_t *)&cbuf,
                               realloc,(size_t *)&ihcompscale,status);
                  }
                }
                else {
                  ffswap8((double *)tilelen_local,tilenx_local);
                  if (*(int *)(*(long *)(row_local + 8) + 0x43c) == 0x16) {
                    fits_shuffle_8bytes((char *)tilelen_local,tilenx_local,status);
                  }
                  compress2mem_from_mem
                            ((char *)tilelen_local,tilenx_local << 3,(char **)&tilecol,
                             (size_t *)&cbuf,realloc,(size_t *)&ihcompscale,status);
                }
              }
              else {
                ffswap4((int *)tilelen_local,tilenx_local);
                if (*(int *)(*(long *)(row_local + 8) + 0x43c) == 0x16) {
                  fits_shuffle_4bytes((char *)tilelen_local,tilenx_local,status);
                }
                compress2mem_from_mem
                          ((char *)tilelen_local,tilenx_local << 2,(char **)&tilecol,(size_t *)&cbuf
                           ,realloc,(size_t *)&ihcompscale,status);
              }
              ffpclb((fitsfile *)row_local,*(int *)(*(long *)(row_local + 8) + 0x4d8),lStack_48,1,
                     _ihcompscale,(uchar *)_tilecol,status);
            }
            else {
              if (*(int *)(*(long *)(row_local + 8) + 0x43c) == 0x33) {
                if (scale._4_4_ == 2) {
                  ffswap2((short *)_zbitpix,tilenx_local);
                }
                else if (scale._4_4_ == 4) {
                  ffswap4((int *)_zbitpix,tilenx_local);
                }
                hcompscale = SUB84(cbuf,0);
                ffpmsg("bzip2 compression error");
                *status = 0x19d;
                return 0x19d;
              }
              if (*(int *)(*(long *)(row_local + 8) + 0x43c) == 0x29) {
                noise2._4_4_ = *(float *)(*(long *)(row_local + 8) + 0x524);
                if (noise2._4_4_ <= 0.0) {
                  if (noise2._4_4_ < 0.0) {
                    noise2._4_4_ = noise2._4_4_ * -1.0;
                  }
                }
                else {
                  fits_img_stats_int((int *)_zbitpix,(long)idata,tileny,nullcheck,intlength,
                                     (long *)0x0,(int *)0x0,(int *)0x0,(double *)0x0,(double *)0x0,
                                     (double *)0x0,&noise3,&noise5,bscale,status);
                  if (((noise3 != 0.0) || (NAN(noise3))) && (noise3 < noise5)) {
                    noise5 = noise3;
                  }
                  if (((bscale[0] != 0.0) || (NAN(bscale[0]))) && (bscale[0] < noise5)) {
                    noise5 = bscale[0];
                  }
                  noise2._4_4_ = (float)((double)noise2._4_4_ * noise5);
                }
                local_d0 = (int)(noise2._4_4_ + 0.5);
                lldata = (LONGLONG *)cbuf;
                if ((flag == 8) || (flag == 0x10)) {
                  fits_hcompress((int *)_zbitpix,(int)idata,(int)tileny,local_d0,(char *)_tilecol,
                                 (long *)&lldata,status);
                }
                else {
                  fits_int_to_longlong_inplace((int *)_zbitpix,tilenx_local,status);
                  fits_hcompress64(_zbitpix,(int)idata,(int)tileny,local_d0,(char *)_tilecol,
                                   (long *)&lldata,status);
                }
                ffpclb((fitsfile *)row_local,*(int *)(*(long *)(row_local + 8) + 0x4d8),lStack_48,1,
                       (LONGLONG)lldata,(uchar *)_tilecol,status);
              }
            }
            if (0 < *(int *)(*(long *)(row_local + 8) + 0x4e4)) {
              ffpcld((fitsfile *)row_local,*(int *)(*(long *)(row_local + 8) + 0x4e4),lStack_48,1,1,
                     bzero,status);
              ffpcld((fitsfile *)row_local,*(int *)(*(long *)(row_local + 8) + 0x4e8),lStack_48,1,1,
                     (double *)&hcomp_len,status);
            }
            free(_tilecol);
          }
          outfptr_local._4_4_ = *status;
        }
        else {
          outfptr_local._4_4_ = *status;
        }
      }
    }
    else {
      ffpmsg("Lossless compression of floating point images must use GZIP (imcomp_compress_tile)");
      *status = 0x19d;
      outfptr_local._4_4_ = 0x19d;
    }
  }
  else {
    outfptr_local._4_4_ = *status;
  }
  return outfptr_local._4_4_;
}

Assistant:

int imcomp_compress_tile (fitsfile *outfptr,
    long row,  /* tile number = row in the binary table that holds the compressed data */
    int datatype, 
    void *tiledata, 
    long tilelen,
    long tilenx,
    long tileny,
    int nullcheck,
    void *nullflagval,
    int *status)

/*
   This is the main compression routine.

   This routine does the following to the input tile of pixels:
        - if it is a float or double image, then it quantizes the pixels
        - compresses the integer pixel values
        - writes the compressed byte stream to the FITS file.

   If the tile cannot be quantized than the raw float or double values
   are losslessly compressed with gzip and then written to the output table.
   
   This input array may be modified by this routine.  If the array is of type TINT
   or TFLOAT, and the compression type is HCOMPRESS, then it must have been 
   allocated to be twice as large (8 bytes per pixel) to provide scratch space.

  Note that this routine does not fully support the implicit datatype conversion that
  is supported when writing to normal FITS images.  The datatype of the input array
  must have the same datatype (either signed or unsigned) as the output (compressed)
  FITS image in some cases.
*/
{
    int *idata;		/* quantized integer data */
    int cn_zblank, zbitpix, nullval;
    int flag = 1;  /* true by default; only = 0 if float data couldn't be quantized */
    int intlength;      /* size of integers to be compressed */
    double scale, zero, actual_bzero;
    long ii;
    size_t clen;		/* size of cbuf */
    short *cbuf;	/* compressed data */
    int  nelem = 0;		/* number of bytes */
    int tilecol;
    size_t gzip_nelem = 0;
    unsigned int bzlen;
    int ihcompscale;
    float hcompscale;
    double noise2, noise3, noise5;
    double bscale[1] = {1.}, bzero[1] = {0.};	/* scaling parameters */
    long  hcomp_len;
    LONGLONG *lldata;

    if (*status > 0)
        return(*status);

    /* check for special case of losslessly compressing floating point */
    /* images.  Only compression algorithm that supports this is GZIP */
    if ( (outfptr->Fptr)->quantize_level == NO_QUANTIZE) {
       if (((outfptr->Fptr)->compress_type != GZIP_1) &&
           ((outfptr->Fptr)->compress_type != GZIP_2)) {
           switch (datatype) {
            case TFLOAT:
            case TDOUBLE:
            case TCOMPLEX:
            case TDBLCOMPLEX:
              ffpmsg("Lossless compression of floating point images must use GZIP (imcomp_compress_tile)");
              return(*status = DATA_COMPRESSION_ERR);
            default:
              break;
          }
       }
    }

    /* free the previously saved tile if the input tile is for the same row */
    if ((outfptr->Fptr)->tilerow) {  /* has the tile cache been allocated? */

      /* calculate the column bin of the compressed tile */
      tilecol = (row - 1) % ((long)(((outfptr->Fptr)->znaxis[0] - 1) / ((outfptr->Fptr)->tilesize[0])) + 1);
      
      if ((outfptr->Fptr)->tilerow[tilecol] == row) {
        if (((outfptr->Fptr)->tiledata)[tilecol]) {
            free(((outfptr->Fptr)->tiledata)[tilecol]);
        }
	  
        if (((outfptr->Fptr)->tilenullarray)[tilecol]) {
            free(((outfptr->Fptr)->tilenullarray)[tilecol]);
        }

        ((outfptr->Fptr)->tiledata)[tilecol] = 0;
        ((outfptr->Fptr)->tilenullarray)[tilecol] = 0;
        (outfptr->Fptr)->tilerow[tilecol] = 0;
        (outfptr->Fptr)->tiledatasize[tilecol] = 0;
        (outfptr->Fptr)->tiletype[tilecol] = 0;
        (outfptr->Fptr)->tileanynull[tilecol] = 0;
      }
    }

    if ( (outfptr->Fptr)->compress_type == NOCOMPRESS) {
         /* Special case when using NOCOMPRESS for diagnostic purposes in fpack */
         if (imcomp_write_nocompress_tile(outfptr, row, datatype, tiledata, tilelen, 
	     nullcheck, nullflagval, status) > 0) {
             return(*status);
         }
         return(*status);
    }

    /* =========================================================================== */
    /* initialize various parameters */
    idata = (int *) tiledata;   /* may overwrite the input tiledata in place */

    /* zbitpix is the BITPIX keyword value in the uncompressed FITS image */
    zbitpix = (outfptr->Fptr)->zbitpix;

    /* if the tile/image has an integer datatype, see if a null value has */
    /* been defined (with the BLANK keyword in a normal FITS image).  */
    /* If so, and if the input tile array also contains null pixels, */
    /* (represented by pixels that have a value = nullflagval) then  */
    /* any pixels whose value = nullflagval, must be set to the value = nullval */
    /* before the pixel array is compressed.  These null pixel values must */
    /* not be inverse scaled by the BSCALE/BZERO values, if present. */

    cn_zblank = (outfptr->Fptr)->cn_zblank;
    nullval = (outfptr->Fptr)->zblank;

    if (zbitpix > 0 && cn_zblank != -1)  /* If the integer image has no defined null */
        nullcheck = 0;    /* value, then don't bother checking input array for nulls. */

    /* if the BSCALE and BZERO keywords exist, then the input values must */
    /* be inverse scaled by this factor, before the values are compressed. */
    /* (The program may have turned off scaling, which over rides the keywords) */
    
    scale = (outfptr->Fptr)->cn_bscale;
    zero  = (outfptr->Fptr)->cn_bzero;
    actual_bzero = (outfptr->Fptr)->cn_actual_bzero;

    /* =========================================================================== */
    /* prepare the tile of pixel values for compression */
    if (datatype == TSHORT) {
       imcomp_convert_tile_tshort(outfptr, tiledata, tilelen, nullcheck, nullflagval,
           nullval, zbitpix, scale, zero, actual_bzero, &intlength, status);
    } else if (datatype == TUSHORT) {
       imcomp_convert_tile_tushort(outfptr, tiledata, tilelen, nullcheck, nullflagval,
           nullval, zbitpix, scale, zero, &intlength, status);
    } else if (datatype == TBYTE) {
       imcomp_convert_tile_tbyte(outfptr, tiledata, tilelen, nullcheck, nullflagval,
           nullval, zbitpix, scale, zero,  &intlength, status);
    } else if (datatype == TSBYTE) {
       imcomp_convert_tile_tsbyte(outfptr, tiledata, tilelen, nullcheck, nullflagval,
           nullval, zbitpix, scale, zero,  &intlength, status);
    } else if (datatype == TINT) {
       imcomp_convert_tile_tint(outfptr, tiledata, tilelen, nullcheck, nullflagval,
           nullval, zbitpix, scale, zero, &intlength, status);
    } else if (datatype == TUINT) {
       imcomp_convert_tile_tuint(outfptr, tiledata, tilelen, nullcheck, nullflagval,
           nullval, zbitpix, scale, zero, &intlength, status);
    } else if (datatype == TLONG && sizeof(long) == 8) {
           ffpmsg("Integer*8 Long datatype is not supported when writing to compressed images");
           return(*status = BAD_DATATYPE);
    } else if (datatype == TULONG && sizeof(long) == 8) {
           ffpmsg("Unsigned integer*8 datatype is not supported when writing to compressed images");
           return(*status = BAD_DATATYPE);
    } else if (datatype == TFLOAT) {
        imcomp_convert_tile_tfloat(outfptr, row, tiledata, tilelen, tilenx, tileny, nullcheck,
        nullflagval, nullval, zbitpix, scale, zero, &intlength, &flag, bscale, bzero, status);
    } else if (datatype == TDOUBLE) {
       imcomp_convert_tile_tdouble(outfptr, row, tiledata, tilelen, tilenx, tileny, nullcheck,
       nullflagval, nullval, zbitpix, scale, zero, &intlength, &flag, bscale, bzero, status);
    } else {
          ffpmsg("unsupported image datatype (imcomp_compress_tile)");
          return(*status = BAD_DATATYPE);
    }

    if (*status > 0)
      return(*status);      /* return if error occurs */

    /* =========================================================================== */
    if (flag)   /* now compress the integer data array */
    {
        /* allocate buffer for the compressed tile bytes */
        clen = (outfptr->Fptr)->maxelem;
        cbuf = (short *) calloc (clen, sizeof (unsigned char));

        if (cbuf == NULL) {
            ffpmsg("Memory allocation failure. (imcomp_compress_tile)");
	    return (*status = MEMORY_ALLOCATION);
        }

        /* =========================================================================== */
        if ( (outfptr->Fptr)->compress_type == RICE_1)
        {
            if (intlength == 2) {
  	        nelem = fits_rcomp_short ((short *)idata, tilelen, (unsigned char *) cbuf,
                       clen, (outfptr->Fptr)->rice_blocksize);
            } else if (intlength == 1) {
  	        nelem = fits_rcomp_byte ((signed char *)idata, tilelen, (unsigned char *) cbuf,
                       clen, (outfptr->Fptr)->rice_blocksize);
            } else {
  	        nelem = fits_rcomp (idata, tilelen, (unsigned char *) cbuf,
                       clen, (outfptr->Fptr)->rice_blocksize);
            }

	    if (nelem < 0)  /* data compression error condition */
            {
	        free (cbuf);
                ffpmsg("error Rice compressing image tile (imcomp_compress_tile)");
                return (*status = DATA_COMPRESSION_ERR);
            }

	    /* Write the compressed byte stream. */
            ffpclb(outfptr, (outfptr->Fptr)->cn_compressed, row, 1,
                     nelem, (unsigned char *) cbuf, status);
        }

        /* =========================================================================== */
        else if ( (outfptr->Fptr)->compress_type == PLIO_1)
        {
              for (ii = 0; ii < tilelen; ii++)  {
                if (idata[ii] < 0 || idata[ii] > 16777215)
                {
                   /* plio algorithn only supports positive 24 bit ints */
                   ffpmsg("data out of range for PLIO compression (0 - 2**24)");
                   return(*status = DATA_COMPRESSION_ERR);
                }
              }

  	      nelem = pl_p2li (idata, 1, cbuf, tilelen);

	      if (nelem < 0)  /* data compression error condition */
              {
	        free (cbuf);
                ffpmsg("error PLIO compressing image tile (imcomp_compress_tile)");
                return (*status = DATA_COMPRESSION_ERR);
              }

	      /* Write the compressed byte stream. */
              ffpcli(outfptr, (outfptr->Fptr)->cn_compressed, row, 1,
                     nelem, cbuf, status);
        }

        /* =========================================================================== */
        else if ( ((outfptr->Fptr)->compress_type == GZIP_1) ||
                  ((outfptr->Fptr)->compress_type == GZIP_2) )   {

	    if ((outfptr->Fptr)->quantize_level == NO_QUANTIZE && datatype == TFLOAT) {
	      /* Special case of losslessly compressing floating point pixels with GZIP */
	      /* In this case we compress the input tile array directly */

#if BYTESWAPPED
               ffswap4((int*) tiledata, tilelen); 
#endif
               if ( (outfptr->Fptr)->compress_type == GZIP_2 )
		    fits_shuffle_4bytes((char *) tiledata, tilelen, status);

                compress2mem_from_mem((char *) tiledata, tilelen * sizeof(float),
                    (char **) &cbuf,  &clen, realloc, &gzip_nelem, status);

	    } else if ((outfptr->Fptr)->quantize_level == NO_QUANTIZE && datatype == TDOUBLE) {
	      /* Special case of losslessly compressing double pixels with GZIP */
	      /* In this case we compress the input tile array directly */

#if BYTESWAPPED
               ffswap8((double *) tiledata, tilelen); 
#endif
               if ( (outfptr->Fptr)->compress_type == GZIP_2 )
		    fits_shuffle_8bytes((char *) tiledata, tilelen, status);

                compress2mem_from_mem((char *) tiledata, tilelen * sizeof(double),
                    (char **) &cbuf,  &clen, realloc, &gzip_nelem, status);

	    } else {

	        /* compress the integer idata array */

#if BYTESWAPPED
	       if (intlength == 2)
                 ffswap2((short *) idata, tilelen); 
	       else if (intlength == 4)
                 ffswap4(idata, tilelen); 
#endif

               if (intlength == 2) {

                  if ( (outfptr->Fptr)->compress_type == GZIP_2 )
		    fits_shuffle_2bytes((char *) tiledata, tilelen, status);

                  compress2mem_from_mem((char *) idata, tilelen * sizeof(short),
                   (char **) &cbuf,  &clen, realloc, &gzip_nelem, status);

               } else if (intlength == 1) {

                  compress2mem_from_mem((char *) idata, tilelen * sizeof(unsigned char),
                   (char **) &cbuf,  &clen, realloc, &gzip_nelem, status);

               } else {

                  if ( (outfptr->Fptr)->compress_type == GZIP_2 )
		    fits_shuffle_4bytes((char *) tiledata, tilelen, status);

                  compress2mem_from_mem((char *) idata, tilelen * sizeof(int),
                   (char **) &cbuf,  &clen, realloc, &gzip_nelem, status);
               }
            }

	    /* Write the compressed byte stream. */
            ffpclb(outfptr, (outfptr->Fptr)->cn_compressed, row, 1,
                     gzip_nelem, (unsigned char *) cbuf, status);

        /* =========================================================================== */
        } else if ( (outfptr->Fptr)->compress_type == BZIP2_1) {

#if BYTESWAPPED
	   if (intlength == 2)
               ffswap2((short *) idata, tilelen); 
	   else if (intlength == 4)
               ffswap4(idata, tilelen); 
#endif

           bzlen = (unsigned int) clen;
	   
           /* call bzip2 with blocksize = 900K, verbosity = 0, and default workfactor */

/*  bzip2 is not supported in the public release.  This is only for test purposes.
           if (BZ2_bzBuffToBuffCompress( (char *) cbuf, &bzlen,
	         (char *) idata, (unsigned int) (tilelen * intlength), 9, 0, 0) ) 
*/
	   {
                   ffpmsg("bzip2 compression error");
                   return(*status = DATA_COMPRESSION_ERR);
           }

	    /* Write the compressed byte stream. */
            ffpclb(outfptr, (outfptr->Fptr)->cn_compressed, row, 1,
                     bzlen, (unsigned char *) cbuf, status);

        /* =========================================================================== */
        }  else if ( (outfptr->Fptr)->compress_type == HCOMPRESS_1)     {
	    /*
	      if hcompscale is positive, then we have to multiply
	      the value by the RMS background noise to get the 
	      absolute scale value.  If negative, then it gives the
	      absolute scale value directly.
	    */
            hcompscale = (outfptr->Fptr)->hcomp_scale;

	    if (hcompscale > 0.) {
	       fits_img_stats_int(idata, tilenx, tileny, nullcheck,
	                nullval, 0,0,0,0,0,0,&noise2,&noise3,&noise5,status);

		/* use the minimum of the 3 noise estimates */
		if (noise2 != 0. && noise2 < noise3) noise3 = noise2;
		if (noise5 != 0. && noise5 < noise3) noise3 = noise5;
		
		hcompscale = (float) (hcompscale * noise3);

	    } else if (hcompscale < 0.) {

		hcompscale = hcompscale * -1.0F;
	    }

	    ihcompscale = (int) (hcompscale + 0.5);

            hcomp_len = clen;  /* allocated size of the buffer */
	    
            if (zbitpix == BYTE_IMG || zbitpix == SHORT_IMG) {
                fits_hcompress(idata, tilenx, tileny, 
		  ihcompscale, (char *) cbuf, &hcomp_len, status);

            } else {
                 /* have to convert idata to an I*8 array, in place */
                 /* idata must have been allocated large enough to do this */

                fits_int_to_longlong_inplace(idata, tilelen, status);
                lldata = (LONGLONG *) idata;		

                fits_hcompress64(lldata, tilenx, tileny, 
		  ihcompscale, (char *) cbuf, &hcomp_len, status);
            }

	    /* Write the compressed byte stream. */
            ffpclb(outfptr, (outfptr->Fptr)->cn_compressed, row, 1,
                     hcomp_len, (unsigned char *) cbuf, status);
        }

        /* =========================================================================== */
        if ((outfptr->Fptr)->cn_zscale > 0)
        {
              /* write the linear scaling parameters for this tile */
	      ffpcld (outfptr, (outfptr->Fptr)->cn_zscale, row, 1, 1,
                      bscale, status);
	      ffpcld (outfptr, (outfptr->Fptr)->cn_zzero,  row, 1, 1,
                      bzero,  status);
        }

        free(cbuf);  /* finished with this buffer */

    /* =========================================================================== */
    } else {    /* if flag == 0., floating point data couldn't be quantized */

	 /* losslessly compress the data with gzip. */

         /* if gzip2 compressed data column doesn't exist, create it */
         if ((outfptr->Fptr)->cn_gzip_data < 1) {
              if ( (outfptr->Fptr)->request_huge_hdu != 0) {
                 fits_insert_col(outfptr, 999, "GZIP_COMPRESSED_DATA", "1QB", status);
              } else {
                 fits_insert_col(outfptr, 999, "GZIP_COMPRESSED_DATA", "1PB", status);
              }

                 if (*status <= 0)  /* save the number of this column */
                       ffgcno(outfptr, CASEINSEN, "GZIP_COMPRESSED_DATA",
                                &(outfptr->Fptr)->cn_gzip_data, status);
         }

         if (datatype == TFLOAT)  {
               /* allocate buffer for the compressed tile bytes */
	       /* make it 10% larger than the original uncompressed data */
               clen = (size_t) (tilelen * sizeof(float) * 1.1);
               cbuf = (short *) calloc (clen, sizeof (unsigned char));

               if (cbuf == NULL)
               {
                   ffpmsg("Memory allocation error. (imcomp_compress_tile)");
	           return (*status = MEMORY_ALLOCATION);
               }

	       /* convert null values to NaNs in place, if necessary */
	       if (nullcheck == 1) {
	           imcomp_float2nan((float *) tiledata, tilelen, (int *) tiledata,
	               *(float *) (nullflagval), status);
	       }

#if BYTESWAPPED
               ffswap4((int*) tiledata, tilelen); 
#endif
               compress2mem_from_mem((char *) tiledata, tilelen * sizeof(float),
                    (char **) &cbuf,  &clen, realloc, &gzip_nelem, status);

         } else {  /* datatype == TDOUBLE */

               /* allocate buffer for the compressed tile bytes */
	       /* make it 10% larger than the original uncompressed data */
               clen = (size_t) (tilelen * sizeof(double) * 1.1);
               cbuf = (short *) calloc (clen, sizeof (unsigned char));

               if (cbuf == NULL)
               {
                   ffpmsg("Memory allocation error. (imcomp_compress_tile)");
	           return (*status = MEMORY_ALLOCATION);
               }

	       /* convert null values to NaNs in place, if necessary */
	       if (nullcheck == 1) {
	           imcomp_double2nan((double *) tiledata, tilelen, (LONGLONG *) tiledata,
	               *(double *) (nullflagval), status);
	       }

#if BYTESWAPPED
               ffswap8((double*) tiledata, tilelen); 
#endif
               compress2mem_from_mem((char *) tiledata, tilelen * sizeof(double),
                    (char **) &cbuf,  &clen, realloc, &gzip_nelem, status);
        }

	/* Write the compressed byte stream. */
        ffpclb(outfptr, (outfptr->Fptr)->cn_gzip_data, row, 1,
             gzip_nelem, (unsigned char *) cbuf, status);

        free(cbuf);  /* finished with this buffer */
    }

    return(*status);
}